

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_enum_all_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  mtbddnode_t node;
  MTBDD variables_00;
  mtbddnode_t n;
  MTBDD res;
  MTBDD res_1;
  MTBDD high;
  MTBDD low;
  mtbddnode_t ndd;
  mtbddnode_t nv;
  mtbdd_enum_filter_cb filter_cb_local;
  uint8_t *arr_local;
  MTBDD variables_local;
  MTBDD dd_local;
  
  if (dd == 0) {
    dd_local = 0;
  }
  else if (variables == 0x8000000000000000) {
    dd_local = 0;
  }
  else {
    node = MTBDD_GETNODE(variables);
    variables_00 = mtbddnode_followhigh(variables,node);
    n = MTBDD_GETNODE(dd);
    iVar1 = mtbdd_isleaf(dd);
    res_1 = dd;
    high = dd;
    if (iVar1 == 0) {
      uVar2 = mtbddnode_getvariable(n);
      uVar3 = mtbddnode_getvariable(node);
      if (uVar2 == uVar3) {
        high = mtbddnode_followlow(dd,n);
        res_1 = mtbddnode_followhigh(dd,n);
      }
    }
    else if ((filter_cb != (mtbdd_enum_filter_cb)0x0) && (iVar1 = (*filter_cb)(dd), iVar1 == 0)) {
      return 0;
    }
    if (*arr == '\0') {
      dd_local = mtbdd_enum_all_next(high,variables_00,arr + 1,filter_cb);
      if (dd_local == 0) {
        dd_local = mtbdd_enum_all_first(res_1,variables_00,arr + 1,filter_cb);
        if (dd_local == 0) {
          dd_local = 0;
        }
        else {
          *arr = '\x01';
        }
      }
    }
    else if (*arr == '\x01') {
      dd_local = mtbdd_enum_all_next(res_1,variables_00,arr + 1,filter_cb);
    }
    else {
      if ((*arr != '\0') && (*arr != '\x01')) {
        __assert_fail("*arr == 0 || *arr == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                      ,0xaa1,
                      "MTBDD mtbdd_enum_all_next(MTBDD, MTBDD, uint8_t *, mtbdd_enum_filter_cb)");
      }
      dd_local = 0xffffffffffffffff;
    }
  }
  return dd_local;
}

Assistant:

MTBDD
mtbdd_enum_all_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf False is skipped
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // if this assertion fails, then <variables> is not the support of <dd>.
        // actually, remove this check to allow for "partial" enumeration
        // assert(mtbdd_isleaf(dd));
        // no next if there are no variables
        return mtbdd_false;
    } else {
        // get next variable from <variables>
        mtbddnode_t nv = MTBDD_GETNODE(variables);
        variables = node_gethigh(variables, nv);

        // filter leaf (if leaf) or get cofactors (if not leaf)
        mtbddnode_t ndd = MTBDD_GETNODE(dd);
        MTBDD low, high;
        if (mtbdd_isleaf(dd)) {
            // a leaf for which the filter returns 0 is skipped
            if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
            low = high = dd;
        } else {
            // get cofactors
            if (mtbddnode_getvariable(ndd) == mtbddnode_getvariable(nv)) {
                low = node_getlow(dd, ndd);
                high = node_gethigh(dd, ndd);
            } else {
                low = high = dd;
            }
        }

        // try recursive next first
        if (*arr == 0) {
            MTBDD res = mtbdd_enum_all_next(low, variables, arr+1, filter_cb);
            if (res != mtbdd_false) return res;
        } else if (*arr == 1) {
            return mtbdd_enum_all_next(high, variables, arr+1, filter_cb);
            // if *arr was 1 and _next returns False, return False
        } else {
            // the array is invalid...
            assert(*arr == 0 || *arr == 1);
            return mtbdd_invalid;  // in Release mode, the assertion is empty code
        }

        // previous was low, try following high
        MTBDD res = mtbdd_enum_all_first(high, variables, arr+1, filter_cb);
        if (res == mtbdd_false) return mtbdd_false;

        // succesful, set arr
        *arr = 1;
        return res;
    }
}